

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O1

FileRecord * __thiscall
diy::FileStorage::extract_file_record(FileRecord *__return_storage_ptr__,FileStorage *this,int i)

{
  pointer pcVar1;
  CriticalMap *this_00;
  mapped_type *pmVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::_Rb_tree_iterator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  pVar3;
  CriticalMapAccessor accessor;
  int local_3c;
  CriticalMap *local_38;
  unique_lock<tthread::fast_mutex> local_30;
  
  local_38 = &this->filenames_;
  local_30._M_device = &(this->filenames_).m_;
  local_30._M_owns = false;
  local_3c = i;
  std::unique_lock<tthread::fast_mutex>::lock(&local_30);
  local_30._M_owns = true;
  pmVar2 = std::
           map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
           ::operator[](&local_38->x_,&local_3c);
  __return_storage_ptr__->size = pmVar2->size;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  pcVar1 = (pmVar2->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->name,pcVar1,pcVar1 + (pmVar2->name)._M_string_length
            );
  this_00 = local_38;
  pVar3 = std::
          _Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
          ::equal_range((_Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
                         *)local_38,&local_3c);
  std::
  _Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
                  *)this_00,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
  if ((local_30._M_owns != false) && (local_30._M_device != (fast_mutex *)0x0)) {
    LOCK();
    (local_30._M_device)->mLock = 0;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

FileRecord    extract_file_record(int i)
      {
        CriticalMapAccessor accessor = filenames_.access();
        FileRecord fr = (*accessor)[i];
        accessor->erase(i);
        return fr;
      }